

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void Configlist_init(void)

{
  current = (config *)0x0;
  currentend = &current;
  basis = (config *)0x0;
  basisend = &basis;
  Configtable_init();
  return;
}

Assistant:

void Configlist_init(void){
  current = 0;
  currentend = &current;
  basis = 0;
  basisend = &basis;
  Configtable_init();
  return;
}